

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

int sha384_init(sha512_state *md)

{
  sha512_state *md_local;
  
  if (md == (sha512_state *)0x0) {
    md_local._4_4_ = -1;
  }
  else {
    md->curlen = 0;
    md->length = 0;
    md->state[0] = 0xcbbb9d5dc1059ed8;
    md->state[1] = 0x629a292a367cd507;
    md->state[2] = 0x9159015a3070dd17;
    md->state[3] = 0x152fecd8f70e5939;
    md->state[4] = 0x67332667ffc00b31;
    md->state[5] = 0x8eb44a8768581511;
    md->state[6] = 0xdb0c2e0d64f98fa7;
    md->state[7] = 0x47b5481dbefa4fa4;
    md_local._4_4_ = 0;
  }
  return md_local._4_4_;
}

Assistant:

static int sha384_init(struct sha512_state * md)
{
    if (md == NULL) return -1;

    md->curlen = 0;
    md->length = 0;
    md->state[0] = CONST64(0xcbbb9d5dc1059ed8);
    md->state[1] = CONST64(0x629a292a367cd507);
    md->state[2] = CONST64(0x9159015a3070dd17);
    md->state[3] = CONST64(0x152fecd8f70e5939);
    md->state[4] = CONST64(0x67332667ffc00b31);
    md->state[5] = CONST64(0x8eb44a8768581511);
    md->state[6] = CONST64(0xdb0c2e0d64f98fa7);
    md->state[7] = CONST64(0x47b5481dbefa4fa4);
    return 0;
}